

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SequentialStmtBlock *stmt)

{
  pointer *ppbVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  pointer pEVar4;
  undefined1 this_00 [8];
  pointer begin;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  string *in_R8;
  uint64_t i;
  pointer this_01;
  ulong uVar7;
  string_view sVar8;
  undefined1 auStack_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensitive_list;
  string sensitive_list_str;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  allocator<char> local_31;
  
  if ((stmt->super_StmtBlock).super_Stmt.super_IRNode.comment._M_string_length != 0) {
    sVar8 = indent(this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar8._M_str,
                        sVar8._M_len);
    poVar6 = std::operator<<(poVar6,"// ");
    ppbVar1 = &sensitive_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    strip_newline((string *)ppbVar1,&(stmt->super_StmtBlock).super_Stmt.super_IRNode.comment);
    poVar6 = std::operator<<(poVar6,(string *)ppbVar1);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    std::operator<<(poVar6,'\n');
    std::__cxx11::string::~string
              ((string *)
               &sensitive_list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (this->generator_->debug == true) {
    (stmt->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  sensitive_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  sensitive_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar4 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppbVar1 = &sensitive_list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (this_01 = (stmt->conditions_).
                 super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      begin = sensitive_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start, this_00 = auStack_98, this_01 != pEVar4;
      this_01 = this_01 + 1) {
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:545:21)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:545:21)>
               ::_M_manager;
    local_58._M_unused._M_object = this;
    EventControl::to_string
              ((string *)ppbVar1,this_01,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                *)&local_58);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
    std::__cxx11::string::~string((string *)ppbVar1);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58._M_pod_data,", ",&local_31);
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)
             &sensitive_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
             in_R8);
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  puVar2 = &(this->stream_).super_stringstream.field_0x10;
  puVar3 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar3 = *(long *)puVar3 + 1;
  poVar6 = std::operator<<((ostream *)puVar2,'\n');
  poVar6 = std::operator<<(poVar6,"always_ff @(");
  poVar6 = std::operator<<(poVar6,(string *)
                                  &sensitive_list.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar6 = std::operator<<(poVar6,") begin");
  block_label_abi_cxx11_((string *)&local_58,this,&stmt->super_StmtBlock);
  poVar6 = std::operator<<(poVar6,(string *)local_58._M_pod_data);
  puVar3 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar3 = *(long *)puVar3 + 1;
  std::operator<<(poVar6,'\n');
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  this->indent_ = this->indent_ + 1;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(stmt->super_StmtBlock).stmts_.
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(stmt->super_StmtBlock).stmts_.
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar7 = uVar7 + 1) {
    iVar5 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])(stmt,uVar7);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var,iVar5));
  }
  this->indent_ = this->indent_ - 1;
  sVar8 = indent(this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,sVar8._M_str,sVar8._M_len);
  poVar6 = std::operator<<(poVar6,"end");
  block_label_abi_cxx11_((string *)&local_58,this,&stmt->super_StmtBlock);
  poVar6 = std::operator<<(poVar6,(string *)local_58._M_pod_data);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar6,'\n');
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  std::__cxx11::string::~string
            ((string *)
             &sensitive_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_98);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SequentialStmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    // produce the sensitive list
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    std::vector<std::string> sensitive_list;
    for (const auto& event_control : stmt->get_event_controls()) {
        auto func = [this](const Var* var) { return stream_.var_str(var); };
        sensitive_list.emplace_back(event_control.to_string(func));
    }
    std::string sensitive_list_str =
        string::join(sensitive_list.begin(), sensitive_list.end(), ", ");
    stream_ << stream_.endl() << "always_ff @(" << sensitive_list_str << ") begin"
            << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}